

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cc
# Opt level: O0

void __thiscall fasttext::Matrix::uniform(Matrix *this,real a)

{
  linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL> *in_RDI;
  result_type_conflict1 rVar1;
  int64_t i;
  uniform_real_distribution<double> uniform;
  minstd_rand rng;
  uniform_real_distribution<double> *in_stack_ffffffffffffffd0;
  uniform_real_distribution<double> *this_00;
  
  std::linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL>::
  linear_congruential_engine
            ((linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL> *)
             in_stack_ffffffffffffffd0,(result_type_conflict)in_RDI);
  std::uniform_real_distribution<double>::uniform_real_distribution
            (in_stack_ffffffffffffffd0,(double)in_RDI,6.61661606092223e-318);
  for (this_00 = (uniform_real_distribution<double> *)0x0;
      (long)this_00 < (long)(in_RDI[1]._M_x * in_RDI[2]._M_x);
      this_00 = (uniform_real_distribution<double> *)((long)&(this_00->_M_param)._M_a + 1)) {
    rVar1 = std::uniform_real_distribution<double>::operator()(this_00,in_RDI);
    *(float *)(in_RDI->_M_x + (long)this_00 * 4) = (float)rVar1;
  }
  return;
}

Assistant:

void Matrix::uniform(real a) {
  std::minstd_rand rng(1);
  std::uniform_real_distribution<> uniform(-a, a);
  for (int64_t i = 0; i < (m_ * n_); i++) {
    data_[i] = uniform(rng);
  }
  
  //ofs << data_ << std::endl;
}